

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::visitFunctionStart
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Function *func)

{
  bool bVar1;
  Ok local_119;
  ScopeCtx local_118;
  CanReceiveDebug local_61;
  add_pointer_t<wasm::Function::DebugLocation> local_60;
  type *loc;
  allocator<char> local_41;
  Err local_40;
  Function *local_20;
  Function *func_local;
  IRBuilder *this_local;
  
  local_20 = func;
  func_local = (Function *)this;
  this_local = (IRBuilder *)__return_storage_ptr__;
  bVar1 = std::vector<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>::empty
                    (&this->scopeStack);
  if (bVar1) {
    local_60 = std::
               get_if<wasm::Function::DebugLocation,wasm::IRBuilder::NoDebug,wasm::IRBuilder::CanReceiveDebug,wasm::Function::DebugLocation>
                         (&this->debugLoc);
    if (local_60 != (add_pointer_t<wasm::Function::DebugLocation>)0x0) {
      std::optional<wasm::Function::DebugLocation>::operator=(&local_20->prologLocation,local_60);
    }
    std::
    variant<wasm::IRBuilder::NoDebug,wasm::IRBuilder::CanReceiveDebug,wasm::Function::DebugLocation>
    ::operator=((variant<wasm::IRBuilder::NoDebug,wasm::IRBuilder::CanReceiveDebug,wasm::Function::DebugLocation>
                 *)&this->debugLoc,&local_61);
    ScopeCtx::makeFunc(&local_118,local_20);
    std::vector<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>::push_back
              (&this->scopeStack,&local_118);
    ScopeCtx::~ScopeCtx(&local_118);
    this->func = local_20;
    if (this->binaryPos != (size_t *)0x0) {
      this->lastBinaryPos = *this->binaryPos;
    }
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_119);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"unexpected start of function",&local_41);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_40);
    wasm::Err::~Err(&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::visitFunctionStart(Function* func) {
  if (!scopeStack.empty()) {
    return Err{"unexpected start of function"};
  }
  if (auto* loc = std::get_if<Function::DebugLocation>(&debugLoc)) {
    func->prologLocation = *loc;
  }
  debugLoc = CanReceiveDebug();
  scopeStack.push_back(ScopeCtx::makeFunc(func));
  this->func = func;

  if (binaryPos) {
    lastBinaryPos = *binaryPos;
  }

  return Ok{};
}